

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCore.c
# Opt level: O2

int Map_Mapping(Map_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  iVar5 = p->fSwitching;
  if (p->fVerbose != 0) {
    Map_MappingReportChoices(p);
  }
  Map_MappingSetChoiceLevels(p);
  aVar2 = Abc_Clock();
  Map_MappingCuts(p);
  aVar3 = Abc_Clock();
  p->timeCuts = aVar3 - aVar2;
  aVar2 = Abc_Clock();
  Map_MappingTruths(p);
  aVar3 = Abc_Clock();
  p->timeTruth = aVar3 - aVar2;
  aVar2 = Abc_Clock();
  p->fMappingMode = 0;
  iVar1 = Map_MappingMatches(p);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    aVar3 = Abc_Clock();
    p->timeMatch = aVar3 - aVar2;
    Map_MappingSetRefs(p);
    fVar6 = Map_MappingGetArea(p);
    p->AreaBase = fVar6;
    if (p->fVerbose != 0) {
      fVar6 = p->fRequiredGlo;
      fVar7 = Map_MappingGetAreaFlow(p);
      iVar1 = 0x7cfb82;
      printf("Delay    : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",(double)fVar6,
             (double)fVar7,(double)p->AreaBase,0,"Delay");
      Abc_Print(iVar1,"%s =","Time");
      Abc_Print(iVar1,"%9.2f sec\n",(double)p->timeMatch / 1000000.0);
    }
    iVar1 = 1;
    if (p->fAreaRecovery != 0) {
      aVar2 = Abc_Clock();
      Map_TimeComputeRequiredGlobal(p);
      p->fMappingMode = 1;
      Map_MappingMatches(p);
      Map_MappingSetRefs(p);
      fVar6 = Map_MappingGetArea(p);
      p->AreaFinal = fVar6;
      if (p->fVerbose != 0) {
        fVar6 = p->fRequiredGlo;
        fVar7 = Map_MappingGetAreaFlow(p);
        iVar4 = 0x7cfbc3;
        printf("AreaFlow : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",(double)fVar6,
               (double)fVar7,(double)p->AreaFinal,
               ((double)(p->AreaBase - p->AreaFinal) * 100.0) / (double)p->AreaBase,"Delay");
        Abc_Print(iVar4,"%s =","Time");
        aVar3 = Abc_Clock();
        Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
      }
      aVar3 = Abc_Clock();
      p->timeArea = p->timeArea + (aVar3 - aVar2);
      aVar2 = Abc_Clock();
      if (iVar5 == 0) {
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 2;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar6 = Map_MappingGetArea(p);
        p->AreaFinal = fVar6;
        if (p->fVerbose != 0) {
          iVar4 = 0x7cfc04;
          printf("Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar6,
                 ((double)(p->AreaBase - fVar6) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar4,"%s =","Time");
          aVar3 = Abc_Clock();
          Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
        }
      }
      aVar3 = Abc_Clock();
      p->timeArea = p->timeArea + (aVar3 - aVar2);
      aVar2 = Abc_Clock();
      if (iVar5 == 0) {
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 3;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar6 = Map_MappingGetArea(p);
        p->AreaFinal = fVar6;
        if (p->fVerbose != 0) {
          iVar5 = 0x7cfc04;
          printf("Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar6,
                 ((double)(p->AreaBase - fVar6) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar5,"%s =","Time");
          aVar3 = Abc_Clock();
          Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
        }
      }
      aVar3 = Abc_Clock();
      p->timeArea = p->timeArea + (aVar3 - aVar2);
      aVar2 = Abc_Clock();
      if (p->fSwitching != 0) {
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 4;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar6 = Map_MappingGetArea(p);
        p->AreaFinal = fVar6;
        if (p->fVerbose != 0) {
          iVar5 = 0x7cfc45;
          printf("Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar6,
                 ((double)(p->AreaBase - fVar6) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar5,"%s =","Time");
          aVar3 = Abc_Clock();
          Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
        }
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 4;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar6 = Map_MappingGetArea(p);
        p->AreaFinal = fVar6;
        if (p->fVerbose != 0) {
          iVar5 = 0x7cfc45;
          printf("Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar6,
                 ((double)(p->AreaBase - fVar6) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar5,"%s =","Time");
          aVar3 = Abc_Clock();
          Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
        }
      }
      aVar3 = Abc_Clock();
      p->timeArea = p->timeArea + (aVar3 - aVar2);
    }
    if (p->fVerbose != 0) {
      Map_MappingPrintOutputArrivals(p);
    }
  }
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs technology mapping for the given object graph.]

  Description [The object graph is stored in the mapping manager.
  First, the AND nodes that fanout into POs are collected in the DFS order.
  Two preprocessing steps are performed: the k-feasible cuts are computed 
  for each node and the truth tables are computed for each cut. Next, the 
  delay-optimal matches are assigned for each node, followed by several 
  iterations of area recoveryd: using area flow (global optimization) 
  and using exact area at a node (local optimization).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Map_Mapping( Map_Man_t * p )
{
    int fShowSwitching         = 0;
    int fUseAreaFlow           = 1;
    int fUseExactArea          = !p->fSwitching;
    int fUseExactAreaWithPhase = !p->fSwitching;
    abctime clk;

    //////////////////////////////////////////////////////////////////////
    // perform pre-mapping computations
    if ( p->fVerbose )
        Map_MappingReportChoices( p ); 
    Map_MappingSetChoiceLevels( p ); // should always be called before mapping!
//    return 1;

    // compute the cuts of nodes in the DFS order
    clk = Abc_Clock();
    Map_MappingCuts( p );
    p->timeCuts = Abc_Clock() - clk;
    // derive the truth tables 
    clk = Abc_Clock();
    Map_MappingTruths( p );
    p->timeTruth = Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////
//ABC_PRT( "Truths", Abc_Clock() - clk );

    //////////////////////////////////////////////////////////////////////
    // compute the minimum-delay mapping
    clk = Abc_Clock();
    p->fMappingMode = 0;
    if ( !Map_MappingMatches( p ) )
        return 0;
    p->timeMatch = Abc_Clock() - clk;
    // compute the references and collect the nodes used in the mapping
    Map_MappingSetRefs( p );
    p->AreaBase = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Delay    : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    Map_MappingGetAreaFlow(p), p->AreaBase, 0.0 );
ABC_PRT( "Time", p->timeMatch );
}
    //////////////////////////////////////////////////////////////////////

    if ( !p->fAreaRecovery )
    {
        if ( p->fVerbose )
            Map_MappingPrintOutputArrivals( p );
        return 1;
    }

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using area flow
    clk = Abc_Clock();
    if ( fUseAreaFlow )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover area flow
        p->fMappingMode = 1;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "AreaFlow : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    Map_MappingGetAreaFlow(p), p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using exact area
    clk = Abc_Clock();
    if ( fUseExactArea )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover area
        p->fMappingMode = 2;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using exact area
    clk = Abc_Clock();
    if ( fUseExactAreaWithPhase )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover area
        p->fMappingMode = 3;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using exact area
    clk = Abc_Clock();
    if ( p->fSwitching )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover switching activity
        p->fMappingMode = 4;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}

        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover switching activity
        p->fMappingMode = 4;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    // print the arrival times of the latest outputs
    if ( p->fVerbose )
        Map_MappingPrintOutputArrivals( p );
    return 1;
}